

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ZSTD_DDict *in_RSI;
  long *in_RDI;
  size_t idxRangeMask;
  size_t idx;
  U32 dictID;
  U32 in_stack_ffffffffffffffcc;
  ZSTD_DDictHashSet *in_stack_ffffffffffffffd0;
  ulong local_28;
  size_t local_8;
  
  uVar1 = ZSTD_getDictID_fromDDict(in_RSI);
  local_28 = ZSTD_DDictHashSet_getIndex(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  uVar3 = in_RDI[1] - 1;
  if (in_RDI[2] == in_RDI[1]) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    for (; *(long *)(*in_RDI + local_28 * 8) != 0; local_28 = (uVar3 & local_28) + 1) {
      uVar2 = ZSTD_getDictID_fromDDict(*(ZSTD_DDict **)(*in_RDI + local_28 * 8));
      if (uVar2 == uVar1) {
        *(ZSTD_DDict **)(*in_RDI + local_28 * 8) = in_RSI;
        return 0;
      }
    }
    *(ZSTD_DDict **)(*in_RDI + local_28 * 8) = in_RSI;
    in_RDI[2] = in_RDI[2] + 1;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict) {
    const U32 dictID = ZSTD_getDictID_fromDDict(ddict);
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    RETURN_ERROR_IF(hashSet->ddictPtrCount == hashSet->ddictPtrTableSize, GENERIC, "Hash set is full!");
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    while (hashSet->ddictPtrTable[idx] != NULL) {
        /* Replace existing ddict if inserting ddict with same dictID */
        if (ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]) == dictID) {
            DEBUGLOG(4, "DictID already exists, replacing rather than adding");
            hashSet->ddictPtrTable[idx] = ddict;
            return 0;
        }
        idx &= idxRangeMask;
        idx++;
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    hashSet->ddictPtrTable[idx] = ddict;
    hashSet->ddictPtrCount++;
    return 0;
}